

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecmult_multi_pippenger_max_points(void)

{
  secp256k1_scratch *scratch_00;
  size_t sVar1;
  secp256k1_scratch *psVar2;
  secp256k1_scratch *psVar3;
  secp256k1_callback *error_callback;
  void *pvVar4;
  secp256k1_callback *unaff_retaddr;
  size_t checkpoint;
  size_t total_alloc;
  size_t i;
  int bucket_window;
  size_t n_points_supported;
  secp256k1_scratch *scratch;
  size_t max_size;
  size_t scratch_size;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  size_t in_stack_ffffffffffffffc8;
  secp256k1_scratch *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int bucket_window_00;
  
  scratch_00 = (secp256k1_scratch *)secp256k1_testrand_bits(in_stack_ffffffffffffffbc);
  sVar1 = secp256k1_pippenger_bucket_window_inv(0xb);
  psVar2 = (secp256k1_scratch *)secp256k1_pippenger_scratch_size(sVar1 + 0x200,0xc);
  bucket_window_00 = 0;
  while( true ) {
    if (psVar2 <= scratch_00) {
      if (bucket_window_00 != 0xc) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0x147b,"test condition failed: bucket_window == PIPPENGER_MAX_BUCKET_WINDOW");
        abort();
      }
      return;
    }
    psVar3 = secp256k1_scratch_create
                       ((secp256k1_callback *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (psVar3 == (secp256k1_scratch *)0x0) break;
    error_callback =
         (secp256k1_callback *)
         secp256k1_scratch_checkpoint
                   ((secp256k1_callback *)
                    CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (secp256k1_scratch *)0x13c11f);
    sVar1 = secp256k1_pippenger_max_points(unaff_retaddr,scratch_00);
    if (sVar1 == 0) {
      secp256k1_scratch_destroy
                (error_callback,
                 (secp256k1_scratch *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
      ;
    }
    else {
      bucket_window_00 = secp256k1_pippenger_bucket_window(sVar1);
      in_stack_ffffffffffffffc8 = secp256k1_pippenger_scratch_size(sVar1,bucket_window_00);
      for (in_stack_ffffffffffffffd0 = (secp256k1_scratch *)0x0;
          in_stack_ffffffffffffffd0 < (secp256k1_scratch *)0x5;
          in_stack_ffffffffffffffd0 = (secp256k1_scratch *)(in_stack_ffffffffffffffd0->magic + 1)) {
        pvVar4 = secp256k1_scratch_alloc
                           ((secp256k1_callback *)
                            CONCAT44(bucket_window_00,in_stack_ffffffffffffffd8),
                            in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        if (pvVar4 == (void *)0x0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                  ,0x1474,
                  "test condition failed: secp256k1_scratch_alloc(&CTX->error_callback, scratch, 1)"
                 );
          abort();
        }
        in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 - 1;
      }
      pvVar4 = secp256k1_scratch_alloc
                         ((secp256k1_callback *)CONCAT44(bucket_window_00,in_stack_ffffffffffffffd8)
                          ,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      if (pvVar4 == (void *)0x0) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
                ,0x1477,
                "test condition failed: secp256k1_scratch_alloc(&CTX->error_callback, scratch, total_alloc)"
               );
        abort();
      }
      secp256k1_scratch_apply_checkpoint
                (error_callback,
                 (secp256k1_scratch *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 0x13c2ac);
      secp256k1_scratch_destroy
                (error_callback,
                 (secp256k1_scratch *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
      ;
    }
    scratch_00 = scratch_00 + 8;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
          ,0x1469,"test condition failed: scratch != NULL");
  abort();
}

Assistant:

static void test_ecmult_multi_pippenger_max_points(void) {
    size_t scratch_size = secp256k1_testrand_bits(8);
    size_t max_size = secp256k1_pippenger_scratch_size(secp256k1_pippenger_bucket_window_inv(PIPPENGER_MAX_BUCKET_WINDOW-1)+512, 12);
    secp256k1_scratch *scratch;
    size_t n_points_supported;
    int bucket_window = 0;

    for(; scratch_size < max_size; scratch_size+=256) {
        size_t i;
        size_t total_alloc;
        size_t checkpoint;
        scratch = secp256k1_scratch_create(&CTX->error_callback, scratch_size);
        CHECK(scratch != NULL);
        checkpoint = secp256k1_scratch_checkpoint(&CTX->error_callback, scratch);
        n_points_supported = secp256k1_pippenger_max_points(&CTX->error_callback, scratch);
        if (n_points_supported == 0) {
            secp256k1_scratch_destroy(&CTX->error_callback, scratch);
            continue;
        }
        bucket_window = secp256k1_pippenger_bucket_window(n_points_supported);
        /* allocate `total_alloc` bytes over `PIPPENGER_SCRATCH_OBJECTS` many allocations */
        total_alloc = secp256k1_pippenger_scratch_size(n_points_supported, bucket_window);
        for (i = 0; i < PIPPENGER_SCRATCH_OBJECTS - 1; i++) {
            CHECK(secp256k1_scratch_alloc(&CTX->error_callback, scratch, 1));
            total_alloc--;
        }
        CHECK(secp256k1_scratch_alloc(&CTX->error_callback, scratch, total_alloc));
        secp256k1_scratch_apply_checkpoint(&CTX->error_callback, scratch, checkpoint);
        secp256k1_scratch_destroy(&CTX->error_callback, scratch);
    }
    CHECK(bucket_window == PIPPENGER_MAX_BUCKET_WINDOW);
}